

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O1

void button_inter_command_do_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object widget;
  Am_Object parent;
  Am_Object inter;
  Am_Value new_value;
  Am_Value old_value;
  Am_Value inter_value;
  Am_Object AStack_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Value local_38;
  Am_Value local_28;
  Am_Value local_18;
  
  local_28.type = 0;
  local_28.value.wrapper_value = (Am_Wrapper *)0x0;
  local_38.type = 0;
  local_38.value.wrapper_value = (Am_Wrapper *)0x0;
  local_18.type = 0;
  local_18.value.wrapper_value = (Am_Wrapper *)0x0;
  local_48.data = (Am_Object_Data *)0x0;
  local_40.data = (Am_Object_Data *)0x0;
  local_50.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(command_obj,0x154,0);
  Am_Object::operator=(&local_48,pAVar2);
  Am_Object::Get_Object(&AStack_58,(Am_Slot_Key)command_obj,10);
  Am_Object::operator=(&local_40,&AStack_58);
  Am_Object::~Am_Object(&AStack_58);
  Am_Object::Get_Object(&AStack_58,(Am_Slot_Key)&local_40,10);
  Am_Object::operator=(&local_50,&AStack_58);
  Am_Object::~Am_Object(&AStack_58);
  pAVar2 = Am_Object::Get(&local_50,0x169,1);
  Am_Value::operator=(&local_28,pAVar2);
  pAVar2 = Am_Object::Get(&local_40,0x169,1);
  Am_Value::operator=(&local_18,pAVar2);
  bVar1 = Am_Value::Valid(&local_18);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_50,0x1af,1);
    Am_Value::operator=(&local_38,pAVar2);
  }
  else {
    Am_Value::operator=(&local_38,0);
  }
  Am_Object::Set(&local_50,0x169,&local_38,0);
  Am_Object::Set(command_obj,0x16c,&local_28,0);
  Am_Object::Set(command_obj,0x169,&local_38,0);
  bVar1 = Am_Object::Valid(&local_48);
  if (bVar1) {
    Am_Object::Set(&local_48,0x16c,&local_28,0);
    Am_Object::Set(&local_48,0x169,&local_38,0);
  }
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_48);
  Am_Value::~Am_Value(&local_18);
  Am_Value::~Am_Value(&local_38);
  Am_Value::~Am_Value(&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, button_inter_command_do,
                 (Am_Object command_obj))
{
  Am_Value old_value, new_value, inter_value;

  // set the widget's and parent's value.
  Am_Object parent, inter, widget;
  parent = command_obj.Get(Am_IMPLEMENTATION_PARENT);
  inter = command_obj.Get_Owner();
  widget = inter.Get_Owner();
  old_value = widget.Peek(Am_VALUE);
  inter_value = inter.Peek(Am_VALUE);
  if (inter_value.Valid())
    new_value = widget.Peek(Am_LABEL_OR_ID);
  else
    new_value = (0L);

  Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                       "++ DO method setting the Am_VALUE of "
                           << widget << " to " << new_value);
  Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                       "++ DO method setting the Am_VALUE of "
                           << command_obj << " to " << new_value);
  widget.Set(Am_VALUE, new_value);
  command_obj.Set(Am_OLD_VALUE, old_value);
  command_obj.Set(Am_VALUE, new_value);

  if (parent.Valid()) {
    //set old value to current value
    //old_value=parent.Peek(Am_VALUE); // RGM: This is wrong.
    parent.Set(Am_OLD_VALUE, old_value);
    parent.Set(Am_VALUE, new_value);
  }
}